

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O3

boolean can_blnd(monst *magr,monst *mdef,uchar aatyp,obj *obj)

{
  short sVar1;
  obj *poVar2;
  objclass *poVar3;
  byte bVar4;
  int iVar5;
  bool bVar6;
  obj **ppoVar7;
  
  poVar3 = objects;
  if ((mdef->data->mflags1 & 0x1000) != 0) {
    return '\0';
  }
  switch(aatyp) {
  case '\x01':
    if ((mdef == &youmonst) && (ublindf != (obj *)0x0)) {
      return '\0';
    }
    if ((magr == &youmonst) && ((u._1052_1_ & 1) != 0)) {
      return '\0';
    }
    goto LAB_001edf9c;
  case '\x02':
  case '\x03':
  case '\x04':
  case '\a':
  case '\b':
  case '\t':
    goto LAB_001eded7;
  case '\x05':
  case '\x06':
    if (magr == (monst *)0x0) {
      return '\x01';
    }
    bVar4 = magr->field_0x61 & 1;
    break;
  case '\v':
    if (mdef == &youmonst) {
      if (ublindf == (obj *)0x0) {
        if (u.usleep != 0) {
          return '\0';
        }
      }
      else {
        if (ublindf->otyp != 0xed) {
          return '\0';
        }
        if (u.usleep != 0) {
          return '\0';
        }
      }
      if (u.ucreamed == 0) {
        return '\x01';
      }
      return '\0';
    }
    bVar4 = mdef->field_0x62 & 8;
    break;
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
switchD_001ede10_caseD_c:
    if ((magr != (monst *)0x0) && ((magr->field_0x61 & 1) != 0)) {
      return '\0';
    }
    bVar4 = resists_blnd(mdef);
    return bVar4 ^ 1;
  default:
    if (aatyp != 0xfe) {
      if (aatyp != 0xff) {
        return '\x01';
      }
      goto switchD_001ede10_caseD_c;
    }
  case '\0':
  case '\n':
    if (obj != (obj *)0x0) {
      sVar1 = obj->otyp;
      if (sVar1 == 0x218) {
        if (mdef == &youmonst) {
          bVar6 = false;
          if (ublindf != (obj *)0x0) {
            return '\0';
          }
          if (u.ucreamed != 0) {
            return '\0';
          }
        }
        else {
          bVar6 = false;
        }
      }
      else {
        if (sVar1 == 0x133) {
          return '\x01';
        }
        if (sVar1 != 0x120) {
          return '\0';
        }
        bVar6 = true;
        if ((ublindf != (obj *)0x0 && mdef == &youmonst) && (ublindf->otyp != 0xed)) {
          return '\0';
        }
      }
      if (magr == &youmonst) {
        if (bVar6 || (u._1052_1_ & 1) != 0) {
          return (u._1052_1_ & 1) == 0;
        }
      }
      else if (bVar6) {
        return '\x01';
      }
LAB_001edf9c:
      if (mdef == &youmonst) {
        ppoVar7 = &invent;
      }
      else {
        ppoVar7 = &mdef->minvent;
      }
      poVar2 = *ppoVar7;
      while( true ) {
        if (poVar2 == (obj *)0x0) {
          return '\x01';
        }
        if ((((poVar2->owornmask & 4) != 0) &&
            (obj_descr[poVar3[poVar2->otyp].oc_descr_idx].oc_descr != (char *)0x0)) &&
           (iVar5 = strcmp(obj_descr[poVar3[poVar2->otyp].oc_descr_idx].oc_descr,"visored helmet"),
           iVar5 == 0)) break;
        poVar2 = poVar2->nobj;
      }
    }
    return '\0';
  }
  if (bVar4 != 0) {
    return '\0';
  }
LAB_001eded7:
  return '\x01';
}

Assistant:

boolean can_blnd(struct monst *magr,	/* NULL == no specific aggressor */
		 struct monst *mdef,
		 uchar aatyp,
		 struct obj *obj)	/* aatyp == AT_WEAP, AT_SPIT */
{
	boolean is_you = (mdef == &youmonst);
	boolean check_visor = FALSE;
	struct obj *o;
	const char *s;

	/* no eyes protect against all attacks for now */
	if (!haseyes(mdef->data))
	    return FALSE;

	switch(aatyp) {
	case AT_EXPL: case AT_BOOM: case AT_GAZE: case AT_MAGC:
	case AT_BREA: /* assumed to be lightning */
	    /* light-based attacks may be cancelled or resisted */
	    if (magr && magr->mcan)
		return FALSE;
	    return !resists_blnd(mdef);

	case AT_WEAP: case AT_SPIT: case AT_NONE:
	    /* an object is used (thrown/spit/other) */
	    if (obj && (obj->otyp == CREAM_PIE)) {
		if (is_you && Blindfolded)
		    return FALSE;
	    } else if (obj && (obj->otyp == BLINDING_VENOM)) {
		/* all ublindf, including LENSES, protect, cream-pies too */
		if (is_you && (ublindf || u.ucreamed))
		    return FALSE;
		check_visor = TRUE;
	    } else if (obj && (obj->otyp == POT_BLINDNESS)) {
		return TRUE;	/* no defense */
	    } else
		return FALSE;	/* other objects cannot cause blindness yet */
	    if ((magr == &youmonst) && u.uswallow)
		return FALSE;	/* can't affect eyes while inside monster */
	    break;

	case AT_ENGL:
	    if (is_you && (Blindfolded || u.usleep || u.ucreamed))
		return FALSE;
	    if (!is_you && mdef->msleeping)
		return FALSE;
	    break;

	case AT_CLAW:
	    /* e.g. raven: all ublindf, including LENSES, protect */
	    if (is_you && ublindf)
		return FALSE;
	    if ((magr == &youmonst) && u.uswallow)
		return FALSE;	/* can't affect eyes while inside monster */
	    check_visor = TRUE;
	    break;

	case AT_TUCH: case AT_STNG:
	    /* some physical, blind-inducing attacks can be cancelled */
	    if (magr && magr->mcan)
		return FALSE;
	    break;

	default:
	    break;
	}

	/* check if wearing a visor (only checked if visor might help) */
	if (check_visor) {
	    o = (mdef == &youmonst) ? invent : mdef->minvent;
	    for ( ; o; o = o->nobj)
		if ((o->owornmask & W_ARMH) &&
		    (s = OBJ_DESCR(objects[o->otyp])) != NULL &&
		    !strcmp(s, "visored helmet"))
		    return FALSE;
	}

	return TRUE;
}